

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

int utf8_isInvalid4(ENCODING *UNUSED_enc,char *p)

{
  bool local_19;
  char *p_local;
  ENCODING *UNUSED_enc_local;
  
  local_19 = true;
  if (((((p[3] & 0x80U) != 0) && (local_19 = true, (p[3] & 0xc0U) != 0xc0)) &&
      (local_19 = true, (p[2] & 0x80U) != 0)) && (local_19 = true, (p[2] & 0xc0U) != 0xc0)) {
    if (*p == -0x10) {
      local_19 = true;
      if (0x8f < (byte)p[1]) {
        local_19 = (p[1] & 0xc0U) == 0xc0;
      }
    }
    else {
      local_19 = true;
      if ((p[1] & 0x80U) != 0) {
        if (*p == -0xc) {
          local_19 = 0x8f < (byte)p[1];
        }
        else {
          local_19 = (p[1] & 0xc0U) == 0xc0;
        }
      }
    }
  }
  return (int)local_19;
}

Assistant:

static int PTRFASTCALL
utf8_isInvalid4(const ENCODING *UNUSED_P(enc), const char *p)
{
  return UTF8_INVALID4((const unsigned char *)p);
}